

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

ElabSystemTaskKind slang::ast::SemanticFacts::getElabSystemTaskKind(Token token)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  bool bVar1;
  string_view sVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view name;
  undefined1 in_stack_ffffffffffffff38 [16];
  Token *in_stack_ffffffffffffff50;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_4;
  
  sVar2 = parsing::Token::valueText(in_stack_ffffffffffffff50);
  local_28 = sVar2._M_len;
  local_20 = sVar2._M_str;
  sv(in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_);
  bVar3._M_str = in_stack_ffffffffffffff70;
  bVar3._M_len = in_stack_ffffffffffffff68;
  bVar1 = std::operator==(bVar3,in_stack_ffffffffffffff58);
  if (bVar1) {
    local_4 = Fatal;
  }
  else {
    sv(in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_);
    __x._M_str = in_stack_ffffffffffffff70;
    __x._M_len = in_stack_ffffffffffffff68;
    bVar1 = std::operator==(__x,in_stack_ffffffffffffff58);
    if (bVar1) {
      local_4 = Error;
    }
    else {
      sv(in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_);
      __x_00._M_str = in_stack_ffffffffffffff70;
      __x_00._M_len = in_stack_ffffffffffffff68;
      bVar1 = std::operator==(__x_00,in_stack_ffffffffffffff58);
      if (bVar1) {
        local_4 = Warning;
      }
      else {
        bVar3 = sv(in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_);
        __x_01._M_str = local_20;
        __x_01._M_len = local_28;
        bVar1 = std::operator==(__x_01,bVar3);
        if (bVar1) {
          local_4 = Info;
        }
        else {
          sv(in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_);
          __x_02._M_str = local_20;
          __x_02._M_len = local_28;
          bVar1 = std::operator==(__x_02,bVar3);
          if (bVar1) {
            local_4 = StaticAssert;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

ElabSystemTaskKind SemanticFacts::getElabSystemTaskKind(Token token) {
    auto name = token.valueText();
    if (name == "$fatal"sv)
        return ElabSystemTaskKind::Fatal;
    if (name == "$error"sv)
        return ElabSystemTaskKind::Error;
    if (name == "$warning"sv)
        return ElabSystemTaskKind::Warning;
    if (name == "$info"sv)
        return ElabSystemTaskKind::Info;
    if (name == "$static_assert"sv)
        return ElabSystemTaskKind::StaticAssert;
    SLANG_UNREACHABLE;
}